

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Block * __thiscall
soul::PoolAllocator::allocate<soul::heart::Block,soul::Identifier>
          (PoolAllocator *this,Identifier *args)

{
  SourceCodeText *pSVar1;
  UTF8Reader *this_00;
  _lambda_void___1_ local_31;
  string *local_30;
  Block *local_28;
  Block *newObject;
  PoolItem *newItem;
  Identifier *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args;
  args_local = (Identifier *)this;
  newObject = (Block *)allocateSpaceForObject(this,0x78);
  this_00 = &(newObject->super_Object).location.location;
  local_30 = (string *)newItem->size;
  heart::Block::Block((Block *)this_00,(Identifier)local_30);
  local_28 = (Block *)this_00;
  pSVar1 = (SourceCodeText *)
           allocate(soul::Identifier&&)::{lambda(void*)#1}::operator_cast_to_function_pointer
                     (&local_31);
  (newObject->super_Object).location.sourceCode.object = pSVar1;
  return local_28;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }